

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleset.cpp
# Opt level: O1

void __thiscall Ruleset::Ruleset(Ruleset *this)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  WithDiamondsAsTrump *pWVar3;
  WithSpadesAsTrump *this_00;
  WithCloverAsTrump *this_01;
  WithHeartAsTrump *this_02;
  WithJacksAsTrump *this_03;
  WithQueensAsTrump *this_04;
  Rule *pRVar4;
  allocator local_49;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  local_48;
  
  (this->m_nameToRule).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_nameToRule).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_nameToRule).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->m_enabledRules)._M_t._M_impl.super__Rb_tree_header;
  (this->m_enabledRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_enabledRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_enabledRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_enabledRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_enabledRules)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pWVar3 = (WithDiamondsAsTrump *)operator_new(0x20);
  WithDiamondsAsTrump::WithDiamondsAsTrump(pWVar3);
  std::__cxx11::string::string((string *)&local_48,"WithDiamondsAsTrump",&local_49);
  local_48.second = (Rule *)pWVar3;
  std::
  vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
  ::emplace_back<std::pair<std::__cxx11::string,Rule*>>
            ((vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
              *)this,&local_48);
  paVar2 = &local_48.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_48.first._M_dataplus._M_p);
  }
  pWVar3 = (WithDiamondsAsTrump *)operator_new(0x20);
  (pWVar3->super_DifferentTrumpRule).m_trumpCards.super__Vector_base<Card,_std::allocator<Card>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pWVar3->super_DifferentTrumpRule).m_trumpCards.super__Vector_base<Card,_std::allocator<Card>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pWVar3->super_DifferentTrumpRule).super_Rule._vptr_Rule = (_func_int **)0x0;
  (pWVar3->super_DifferentTrumpRule).m_trumpCards.super__Vector_base<Card,_std::allocator<Card>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  WithDiamondsAsTrump::WithDiamondsAsTrump(pWVar3);
  (pWVar3->super_DifferentTrumpRule).super_Rule._vptr_Rule = (_func_int **)&PTR_isTrump_0010ebb8;
  std::__cxx11::string::string((string *)&local_48,"WithoutTrump",&local_49);
  local_48.second = (Rule *)pWVar3;
  std::
  vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
  ::emplace_back<std::pair<std::__cxx11::string,Rule*>>
            ((vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
              *)this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_48.first._M_dataplus._M_p);
  }
  this_00 = (WithSpadesAsTrump *)operator_new(0x20);
  WithSpadesAsTrump::WithSpadesAsTrump(this_00);
  std::__cxx11::string::string((string *)&local_48,"WithSpadesAsTrump",&local_49);
  local_48.second = (Rule *)this_00;
  std::
  vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
  ::emplace_back<std::pair<std::__cxx11::string,Rule*>>
            ((vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
              *)this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_48.first._M_dataplus._M_p);
  }
  this_01 = (WithCloverAsTrump *)operator_new(0x20);
  WithCloverAsTrump::WithCloverAsTrump(this_01);
  std::__cxx11::string::string((string *)&local_48,"WithCloverAsTrump",&local_49);
  local_48.second = (Rule *)this_01;
  std::
  vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
  ::emplace_back<std::pair<std::__cxx11::string,Rule*>>
            ((vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
              *)this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_48.first._M_dataplus._M_p);
  }
  this_02 = (WithHeartAsTrump *)operator_new(0x20);
  WithHeartAsTrump::WithHeartAsTrump(this_02);
  std::__cxx11::string::string((string *)&local_48,"WithHeartAsTrump",&local_49);
  local_48.second = (Rule *)this_02;
  std::
  vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
  ::emplace_back<std::pair<std::__cxx11::string,Rule*>>
            ((vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
              *)this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_48.first._M_dataplus._M_p);
  }
  this_03 = (WithJacksAsTrump *)operator_new(0x20);
  WithJacksAsTrump::WithJacksAsTrump(this_03);
  std::__cxx11::string::string((string *)&local_48,"WithJacksAsTrump",&local_49);
  local_48.second = (Rule *)this_03;
  std::
  vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
  ::emplace_back<std::pair<std::__cxx11::string,Rule*>>
            ((vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
              *)this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_48.first._M_dataplus._M_p);
  }
  this_04 = (WithQueensAsTrump *)operator_new(0x20);
  WithQueensAsTrump::WithQueensAsTrump(this_04);
  std::__cxx11::string::string((string *)&local_48,"WithQueensAsTrump",&local_49);
  local_48.second = (Rule *)this_04;
  std::
  vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
  ::emplace_back<std::pair<std::__cxx11::string,Rule*>>
            ((vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
              *)this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_48.first._M_dataplus._M_p);
  }
  pRVar4 = (Rule *)operator_new(8);
  pRVar4->_vptr_Rule = (_func_int **)&PTR_isTrump_0010ed08;
  std::__cxx11::string::string((string *)&local_48,"SecondH10BeatsFirstH10",&local_49);
  local_48.second = pRVar4;
  std::
  vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
  ::emplace_back<std::pair<std::__cxx11::string,Rule*>>
            ((vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
              *)this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_48.first._M_dataplus._M_p);
  }
  pRVar4 = (Rule *)operator_new(8);
  pRVar4->_vptr_Rule = (_func_int **)&PTR_isTrump_0010ed40;
  std::__cxx11::string::string((string *)&local_48,"TwoDiamondAAreHigh",&local_49);
  local_48.second = pRVar4;
  std::
  vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
  ::emplace_back<std::pair<std::__cxx11::string,Rule*>>
            ((vector<std::pair<std::__cxx11::string,Rule*>,std::allocator<std::pair<std::__cxx11::string,Rule*>>>
              *)this,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.first._M_dataplus._M_p != paVar2) {
    operator_delete(local_48.first._M_dataplus._M_p);
  }
  return;
}

Assistant:

Ruleset::Ruleset(){
    m_nameToRule.push_back(std::make_pair("WithDiamondsAsTrump", new WithDiamondsAsTrump()));
    m_nameToRule.push_back(std::make_pair("WithoutTrump" ,  new WithoutTrump()));
    m_nameToRule.push_back(std::make_pair("WithSpadesAsTrump",new  WithSpadesAsTrump()));
    m_nameToRule.push_back(std::make_pair("WithCloverAsTrump",new WithCloverAsTrump()));
    m_nameToRule.push_back(std::make_pair("WithHeartAsTrump",new WithHeartAsTrump()));
    m_nameToRule.push_back(std::make_pair("WithJacksAsTrump",new WithJacksAsTrump()));
    m_nameToRule.push_back(std::make_pair("WithQueensAsTrump",new WithQueensAsTrump()));
    m_nameToRule.push_back(std::make_pair("SecondH10BeatsFirstH10",new SecondH10BeatsFirst()));
    m_nameToRule.push_back(std::make_pair("TwoDiamondAAreHigh",new TwoDiamondAAreHigh()));
}